

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall
Variable_variableInterfaceDontDowngradeFromPublicAndPrivate_Test::TestBody
          (Variable_variableInterfaceDontDowngradeFromPublicAndPrivate_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  char *pcVar6;
  AssertHelper local_350 [8];
  Message local_348 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_2;
  Message local_308 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar_1;
  Message local_2c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_270 [8];
  Message local_268 [15];
  bool local_259;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_;
  string local_240 [39];
  allocator<char> local_219;
  string local_218 [32];
  undefined1 local_1f8 [8];
  VariablePtr v3;
  string local_1e0 [39];
  allocator<char> local_1b9;
  string local_1b8 [32];
  undefined1 local_198 [8];
  VariablePtr v2;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [32];
  undefined1 local_110 [8];
  VariablePtr v1;
  string local_f8 [39];
  allocator<char> local_d1;
  string local_d0 [39];
  allocator<char> local_a9;
  string local_a8 [55];
  allocator<char> local_71;
  string local_70 [32];
  undefined1 local_50 [8];
  ComponentPtr c3;
  ComponentPtr c2;
  ComponentPtr c1;
  ModelPtr model;
  Variable_variableInterfaceDontDowngradeFromPublicAndPrivate_Test *this_local;
  
  libcellml::Model::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,"model",&local_71);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a8,"c1",&local_a9);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"c2",&local_d1);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"c3",
             (allocator<char> *)
             ((long)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar3);
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar4);
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar4);
  libcellml::Variable::create();
  peVar5 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_110);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"v1",&local_131);
  libcellml::NamedEntity::setName((string *)peVar5);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  peVar5 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_110);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"dimensionless",&local_159);
  libcellml::Variable::setUnits((string *)peVar5);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  peVar5 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_110);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_180,"public_and_private",
             (allocator<char> *)
             ((long)&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::setInterfaceType((string *)peVar5);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::create();
  peVar5 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,"v2",&local_1b9);
  libcellml::NamedEntity::setName((string *)peVar5);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  peVar5 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e0,"dimensionless",
             (allocator<char> *)
             ((long)&v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::setUnits((string *)peVar5);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::create();
  peVar5 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_218,"v3",&local_219);
  libcellml::NamedEntity::setName((string *)peVar5);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator(&local_219);
  peVar5 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_240,"dimensionless",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::Variable::setUnits((string *)peVar5);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar4);
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar4);
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  libcellml::Component::addVariable((shared_ptr *)peVar4);
  libcellml::Variable::addEquivalence((shared_ptr *)local_110,(shared_ptr *)local_198);
  libcellml::Variable::addEquivalence((shared_ptr *)local_198,(shared_ptr *)local_1f8);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  bVar1 = libcellml::Model::fixVariableInterfaces();
  local_259 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_258,&local_259,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar2) {
    testing::Message::Message(local_268);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar.message_,local_258,"model->fixVariableInterfaces()",
               "false");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x6f5,pcVar6);
    testing::internal::AssertHelper::operator=(local_270,local_268);
    testing::internal::AssertHelper::~AssertHelper(local_270);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_110);
  libcellml::Variable::interfaceType_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[19],std::__cxx11::string>
            ((EqHelper<false> *)local_2a0,"\"public_and_private\"","v1->interfaceType()",
             (char (*) [19])"public_and_private",&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar2) {
    testing::Message::Message(local_2c8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x6f7,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_2c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_198);
  libcellml::Variable::interfaceType_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[19],std::__cxx11::string>
            ((EqHelper<false> *)local_2e0,"\"public_and_private\"","v2->interfaceType()",
             (char (*) [19])"public_and_private",&local_300);
  std::__cxx11::string::~string((string *)&local_300);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
  if (!bVar2) {
    testing::Message::Message(local_308);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x6f8,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_1f8);
  libcellml::Variable::interfaceType_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_320,"\"public\"","v3->interfaceType()",(char (*) [7])"public",
             &local_340);
  std::__cxx11::string::~string((string *)&local_340);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar2) {
    testing::Message::Message(local_348);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              (local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x6f9,pcVar6);
    testing::internal::AssertHelper::operator=(local_350,local_348);
    testing::internal::AssertHelper::~AssertHelper(local_350);
    testing::Message::~Message(local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_1f8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_198);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_110);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_50);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &c3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Variable, variableInterfaceDontDowngradeFromPublicAndPrivate)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::ComponentPtr c2 = libcellml::Component::create();
    libcellml::ComponentPtr c3 = libcellml::Component::create();

    model->setName("model");
    c1->setName("c1");
    c2->setName("c2");
    c3->setName("c3");

    model->addComponent(c1);
    c1->addComponent(c2);
    c2->addComponent(c3);

    libcellml::VariablePtr v1 = libcellml::Variable::create();
    v1->setName("v1");
    v1->setUnits("dimensionless");
    v1->setInterfaceType("public_and_private");

    libcellml::VariablePtr v2 = libcellml::Variable::create();
    v2->setName("v2");
    v2->setUnits("dimensionless");

    libcellml::VariablePtr v3 = libcellml::Variable::create();
    v3->setName("v3");
    v3->setUnits("dimensionless");

    c1->addVariable(v1);
    c2->addVariable(v2);
    c3->addVariable(v3);

    libcellml::Variable::addEquivalence(v1, v2);
    libcellml::Variable::addEquivalence(v2, v3);

    EXPECT_TRUE(model->fixVariableInterfaces());

    EXPECT_EQ("public_and_private", v1->interfaceType());
    EXPECT_EQ("public_and_private", v2->interfaceType());
    EXPECT_EQ("public", v3->interfaceType());
}